

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O1

int stbtt_GetFontOffsetForIndex(uchar *font_collection,int index)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  iVar1 = stbtt__isfont(font_collection);
  if (iVar1 == 0) {
    uVar2 = 0xffffffff;
    if ((((*font_collection == 't') && (font_collection[1] == 't')) && (font_collection[2] == 'c'))
       && (font_collection[3] == 'f')) {
      uVar3 = *(uint *)(font_collection + 4);
      uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      if (((uVar3 == 0x20000) || (uVar3 == 0x10000)) &&
         (uVar3 = *(uint *)(font_collection + 8),
         index < (int)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                      uVar3 << 0x18))) {
        uVar2 = *(uint *)(font_collection + (long)index * 4 + 0xc);
        uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      }
    }
  }
  else {
    uVar2 = -(uint)(index != 0);
  }
  return uVar2;
}

Assistant:

STBTT_DEF int stbtt_GetFontOffsetForIndex(const unsigned char *font_collection, int index)
{
   // if it's just a font, there's only one valid index
   if (stbtt__isfont(font_collection))
      return index == 0 ? 0 : -1;

   // check if it's a TTC
   if (stbtt_tag(font_collection, "ttcf")) {
      // version 1?
      if (ttULONG(font_collection+4) == 0x00010000 || ttULONG(font_collection+4) == 0x00020000) {
         stbtt_int32 n = ttLONG(font_collection+8);
         if (index >= n)
            return -1;
         return ttULONG(font_collection+12+index*4);
      }
   }
   return -1;
}